

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

kvtree * kvtree_setf(kvtree *hash,kvtree *hash_value,char *format,...)

{
  char cVar1;
  char in_AL;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  kvtree_elem *pkVar5;
  kvtree *hash_value_00;
  kvtree_struct *pkVar6;
  void **ppvVar7;
  undefined8 in_RCX;
  ulong uVar8;
  uint uVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char *rest;
  char *format_copy;
  char key [1024];
  undefined8 local_528;
  void **local_520;
  char *local_508;
  char *local_500;
  int local_4f4;
  kvtree *local_4f0;
  void *local_4e8 [4];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char local_438 [1032];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if (hash == (kvtree *)0x0) {
    hash = (kvtree_struct *)0x0;
  }
  else {
    local_508 = (char *)0x0;
    local_4f0 = hash_value;
    local_4e8[3] = (void *)in_RCX;
    local_4c8 = in_R8;
    local_4c0 = in_R9;
    pcVar4 = strdup(format);
    local_500 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x138);
    }
    pcVar4 = strtok_r(pcVar4," ",&local_508);
    uVar9 = 0;
    if (pcVar4 != (char *)0x0) {
      do {
        pcVar4 = strtok_r((char *)0x0," ",&local_508);
        uVar9 = uVar9 + 1;
      } while (pcVar4 != (char *)0x0);
    }
    kvtree_free(&local_500);
    local_500 = strdup(format);
    if (local_500 == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x150);
    }
    local_520 = &args[0].overflow_arg_area;
    local_528 = 0x3000000018;
    pcVar4 = strtok_r(local_500," ",&local_508);
    if (pcVar4 != (char *)0x0 && uVar9 != 0) {
      local_4f4 = uVar9 - 1;
      uVar10 = 1;
      do {
        cVar1 = *pcVar4;
        if (cVar1 == '%') {
          if ((pcVar4[1] == 's') && (pcVar4[2] == '\0')) goto LAB_00103d61;
          if ((pcVar4[1] != 'd') || (pcVar4[2] != '\0')) goto LAB_00103ca8;
LAB_00103d9f:
          uVar8 = local_528 & 0xffffffff;
          if (uVar8 < 0x29) {
            local_528 = CONCAT44(local_528._4_4_,(int)local_528 + 8);
            ppvVar7 = (void **)((long)local_4e8 + uVar8);
          }
          else {
            ppvVar7 = local_520;
            local_520 = local_520 + 1;
          }
          uVar3 = snprintf(local_438,0x400,pcVar4,(ulong)*(uint *)ppvVar7);
LAB_00103dda:
          if (0x3ff < uVar3) {
            kvtree_abort(-1,"Key buffer too small, have %lu need %d bytes @ %s:%d",0x400,
                         (ulong)uVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x17a);
          }
        }
        else {
LAB_00103ca8:
          iVar2 = strcmp(pcVar4,"%lld");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar4,"%lu"), iVar2 == 0)) {
LAB_00103d61:
            uVar8 = local_528 & 0xffffffff;
            if (uVar8 < 0x29) {
              local_528 = CONCAT44(local_528._4_4_,(int)local_528 + 8);
              ppvVar7 = (void **)((long)local_4e8 + uVar8);
            }
            else {
              ppvVar7 = local_520;
              local_520 = local_520 + 1;
            }
            uVar3 = snprintf(local_438,0x400,pcVar4,*ppvVar7);
            goto LAB_00103dda;
          }
          iVar2 = strcmp(pcVar4,"%#x");
          if (iVar2 == 0) goto LAB_00103d9f;
          iVar2 = strcmp(pcVar4,"%#lx");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar4,"%llu"), iVar2 == 0)) goto LAB_00103d61;
          if (cVar1 == '%') {
            if ((pcVar4[1] == 'f') && (pcVar4[2] == '\0')) {
              uVar8 = (ulong)local_528._4_4_;
              if (uVar8 < 0xa1) {
                local_528 = CONCAT44(local_528._4_4_ + 0x10,(int)local_528);
                ppvVar7 = (void **)((long)local_4e8 + uVar8);
              }
              else {
                ppvVar7 = local_520;
                local_520 = local_520 + 1;
              }
              uVar3 = snprintf(local_438,0x400,pcVar4,*ppvVar7);
              goto LAB_00103dda;
            }
            if ((pcVar4[1] == 'p') && (pcVar4[2] == '\0')) goto LAB_00103d61;
          }
          kvtree_abort(-1,"Unsupported hash key format \'%s\' @ %s:%d",pcVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                       ,0x173);
        }
        hash_value_00 = local_4f0;
        if ((int)(uVar10 - 1) < local_4f4) {
          pkVar5 = kvtree_elem_get(hash,local_438);
          if ((pkVar5 == (kvtree_elem *)0x0) ||
             (pkVar6 = pkVar5->hash, pkVar5->hash == (kvtree_struct *)0x0)) {
            hash_value_00 =
                 (kvtree *)
                 kvtree_malloc(8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                               ,0x47);
            hash_value_00->lh_first = (kvtree_elem_struct *)0x0;
            goto LAB_00103e5f;
          }
        }
        else {
LAB_00103e5f:
          pkVar6 = kvtree_set(hash,local_438,hash_value_00);
        }
        hash = pkVar6;
        pcVar4 = strtok_r((char *)0x0," ",&local_508);
      } while (((uVar10 < uVar9) && (pcVar4 != (char *)0x0)) &&
              (uVar10 = uVar10 + 1, hash != (kvtree_struct *)0x0));
    }
    kvtree_free(&local_500);
  }
  return hash;
}

Assistant:

kvtree* kvtree_setf(kvtree* hash, kvtree* hash_value, const char* format, ...)
{
  /* check that we have a hash */
  if (hash == NULL) {
    return NULL;
  }

  kvtree* h = hash;
  char *rest = NULL;

  /* make a copy of the format specifier, since strtok will clobber
   * it */
  char* format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* we break up tokens by spaces */
  char* search = " ";
  char* token = NULL;

  /* count how many keys we have */
  token = strtok_r(format_copy, search, &rest);
  int count = 0;
  while (token != NULL) {
    token = strtok_r(NULL, search, &rest);
    count++;
  }

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* make a copy of the format specifier, since strtok will clobber
   * it */
  format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* for each format specifier, convert the next key argument to a
   * string and look up the hash for that key */
  va_list args;
  va_start(args, format);
  token = strtok_r(format_copy, search, &rest);
  int i = 0;
  while (i < count && token != NULL && h != NULL) {
    /* interpret the format and convert the current key argument to
     * a string */
    char key[KVTREE_MAX_LINE];
    int size = 0;
    if (strcmp(token, "%s") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, char*));
    } else if (strcmp(token, "%d")  == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, int));
    } else if (strcmp(token, "%lld") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, long long));
    } else if (strcmp(token, "%lu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%#x") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned int));
    } else if (strcmp(token, "%#lx") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%llu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long long));
    } else if (strcmp(token, "%f") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, double));
    } else if (strcmp(token, "%p") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, void*));
    } else {
      kvtree_abort(-1, "Unsupported hash key format '%s' @ %s:%d",
        token, __FILE__, __LINE__
      );
    }

    /* check that we were able to fit the string into our buffer */
    if (size >= sizeof(key)) {
      kvtree_abort(-1, "Key buffer too small, have %lu need %d bytes @ %s:%d",
        sizeof(key), size, __FILE__, __LINE__
      );
    }

    if (i < count-1) {
      /* check whether we have an entry for this key in the current
       * hash */
      kvtree* tmp = kvtree_get(h, key);

      /* didn't find an entry for this key, so create one */
      if (tmp == NULL) {
        tmp = kvtree_set(h, key, kvtree_new());
      }

      /* now we have a hash for this key, continue with the next key */
      h = tmp;
    } else {
      /* we are at the last key, so set its hash using the value
       * provided by the caller */
      h = kvtree_set(h, key, hash_value);
    }

    /* get the next format string */
    token = strtok_r(NULL, search, &rest);
    i++;
  }
  va_end(args);

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* return the hash we found */
  return h;
}